

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
          (CodedInputStream *this,uint32_t *value)

{
  bool bVar1;
  int iVar2;
  uint8_t *local_30;
  uint8_t *ptr;
  uint32_t *puStack_20;
  uint8_t bytes [4];
  uint32_t *value_local;
  CodedInputStream *this_local;
  
  puStack_20 = value;
  iVar2 = BufferSize(this);
  if (iVar2 < 4) {
    bVar1 = ReadRaw(this,(void *)((long)&ptr + 4),4);
    if (!bVar1) {
      return false;
    }
    local_30 = (uint8_t *)((long)&ptr + 4);
  }
  else {
    local_30 = this->buffer_;
    Advance(this,4);
  }
  ReadLittleEndian32FromArray(local_30,puStack_20);
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian32Fallback(uint32_t* value) {
  uint8_t bytes[sizeof(*value)];

  const uint8_t* ptr;
  if (BufferSize() >= static_cast<int64_t>(sizeof(*value))) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(sizeof(*value));
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, sizeof(*value))) return false;
    ptr = bytes;
  }
  ReadLittleEndian32FromArray(ptr, value);
  return true;
}